

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

Result __thiscall
tonk::Connection::completeIncomingConnection(Connection *this,UDPAddress *peerUDPAddress)

{
  Channel *this_00;
  in6_addr *config;
  ostringstream *this_01;
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint16_t port;
  int iVar4;
  OutputWorker *pOVar5;
  _func_int **pp_Var6;
  UDPAddress *in_RDX;
  allocator local_361;
  undefined1 local_360 [8];
  undefined1 local_358 [24];
  Result flushResult;
  ostringstream local_330 [376];
  TonkAddress appAddress;
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  local_360[0] = (in_RDX->impl_).data_.base.sa_family != 2;
  if ((bool)local_360[0]) {
    local_358._0_8_ = *(undefined8 *)((long)&(in_RDX->impl_).data_ + 8);
    local_358._8_8_ = *(size_type *)((long)&(in_RDX->impl_).data_ + 0x10);
    local_358._16_8_ = ZEXT48((in_RDX->impl_).data_.v6.sin6_scope_id);
    local_360._4_4_ = 0;
  }
  else {
    local_360._4_4_ = (in_RDX->impl_).data_.v6.sin6_flowinfo;
    local_358._16_8_ = 0;
    local_358._0_8_ = 0;
    local_358._8_8_ = 0;
  }
  local_360._1_3_ = 0;
  this_00 = (Channel *)((long)&peerUDPAddress[9].impl_.data_.v6.sin6_addr.__in6_u + 0xc);
  asio::ip::address::to_string_abi_cxx11_((string *)&flushResult,(address *)local_360);
  port = swap_bytes((in_RDX->impl_).data_.v4.sin_port);
  GetConnectionLogPrefix((string *)&appAddress,(string *)&flushResult,port);
  logger::Channel::SetPrefix(this_00,(string *)&appAddress);
  std::__cxx11::string::~string((string *)&appAddress);
  std::__cxx11::string::~string((string *)&flushResult);
  initSubsystems((Connection *)&appAddress);
  uVar2 = appAddress.NetworkString._0_8_;
  appAddress.NetworkString[0] = '\0';
  appAddress.NetworkString[1] = '\0';
  appAddress.NetworkString[2] = '\0';
  appAddress.NetworkString[3] = '\0';
  appAddress.NetworkString[4] = '\0';
  appAddress.NetworkString[5] = '\0';
  appAddress.NetworkString[6] = '\0';
  appAddress.NetworkString[7] = '\0';
  (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar2;
  Result::~Result((Result *)&appAddress);
  if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
    SessionOutgoing::SetPeerUDPAddress
              ((SessionOutgoing *)((long)&peerUDPAddress[0xc].impl_.data_ + 0x18),in_RDX);
    resetTimers((Connection *)peerUDPAddress,
                *(uint32_t *)(*(long *)&peerUDPAddress[8].impl_.data_ + 0x38),true);
    bVar3 = ConnectionIdMap::InsertAndAssignId
                      (*(ConnectionIdMap **)((long)&peerUDPAddress[4].impl_.data_ + 0x18),
                       (id_t *)((long)&peerUDPAddress[0x72d].impl_.data_ + 0x14),
                       (IConnection *)peerUDPAddress);
    if (!bVar3 && *(int *)&peerUDPAddress[10].impl_.data_ < 4) {
      flushResult.Error = (ErrorResult *)this_00->ChannelName;
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,
                      (string *)
                      (peerUDPAddress[0xb].impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
      std::operator<<((ostream *)local_330,
                      "completeConnectionInitialization: Failed to insert new connection into id map"
                     );
      pOVar5 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)&flushResult);
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    queueAddressAndIdChangeMessage((Connection *)peerUDPAddress,in_RDX);
    SetTonkAddressStr(&appAddress,in_RDX);
    lVar1 = *(long *)&peerUDPAddress[8].impl_.data_;
    config = &peerUDPAddress[8].impl_.data_.v6.sin6_addr;
    iVar4 = (**(code **)(lVar1 + 0x50))
                      (*(undefined8 *)(lVar1 + 8),peerUDPAddress,&appAddress,config);
    if (iVar4 == 0) {
      std::__cxx11::string::string
                ((string *)&flushResult,
                 "Application OnIncomingConnection() callback denied connection",&local_361);
      pp_Var6 = (_func_int **)operator_new(0x38);
      *pp_Var6 = (_func_int *)"Connection::completeConnectionInitialization";
      std::__cxx11::string::string((string *)(pp_Var6 + 1),(string *)&flushResult);
      *(undefined4 *)(pp_Var6 + 5) = 0;
      pp_Var6[6] = (_func_int *)0x2;
      (this->super_IConnection)._vptr_IConnection = pp_Var6;
      local_360 = (undefined1  [8])0x0;
      Result::~Result((Result *)local_360);
      std::__cxx11::string::~string((string *)&flushResult);
    }
    else {
      MakeCallbacksOptional((TonkConnectionConfig *)config);
      SessionOutgoing::Flush((SessionOutgoing *)&flushResult);
      if (flushResult.Error != (ErrorResult *)0x0) {
        RefCounter::StartShutdown
                  ((RefCounter *)&(peerUDPAddress->impl_).data_.v6.sin6_addr,2,&flushResult);
      }
      postNextTimer((Connection *)peerUDPAddress);
      Result::~Result(&flushResult);
    }
    if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
      return (Result)(ErrorResult *)this;
    }
  }
  Result::ToJson_abi_cxx11_((string *)local_360,(Result *)this);
  if (*(int *)&peerUDPAddress[10].impl_.data_ < 4) {
    appAddress.NetworkString._0_8_ = this_00->ChannelName;
    this_01 = (ostringstream *)(appAddress.NetworkString + 0x10);
    appAddress.NetworkString[8] = '\x03';
    appAddress.NetworkString[9] = '\0';
    appAddress.NetworkString[10] = '\0';
    appAddress.NetworkString[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,
                    (string *)
                    (peerUDPAddress[0xb].impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
    std::operator<<((ostream *)this_01,"Connection::completeIncomingConnection failed: ");
    std::operator<<((ostream *)this_01,(string *)local_360);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)&appAddress);
    std::__cxx11::ostringstream::~ostringstream(this_01);
  }
  std::__cxx11::string::~string((string *)local_360);
  Shutdown((Connection *)peerUDPAddress);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::completeIncomingConnection(const UDPAddress& peerUDPAddress)
{
    Result result;

    try
    {
        Logger.SetPrefix(GetConnectionLogPrefix(
            peerUDPAddress.address().to_string(),
            peerUDPAddress.port()));

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Update the peer address for outgoing data
        Outgoing.SetPeerUDPAddress(peerUDPAddress);

        // Initialize timers for incoming connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, true);

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("completeConnectionInitialization: Failed to insert new connection into id map");
        }

        // Write control channel data before the OnConnect() callback so that
        // any tonk_flush() will include the control channel data in the first
        // UDP response datagram
        queueAddressAndIdChangeMessage(peerUDPAddress);

        TonkAddress appAddress;
        SetTonkAddressStr(appAddress, peerUDPAddress);

        // FIXME: If this asserts we currently seem to shut down uncleanly
        const uint32_t appDecision = SocketConfig->OnIncomingConnection(
            SocketConfig->AppContextPtr,
            GetTonkConnection(),
            &appAddress,
            &ConnectionConfig);
        if (TONK_DENY_CONNECTION == appDecision)
        {
            result = Result("Connection::completeConnectionInitialization", "Application OnIncomingConnection() callback denied connection", ErrorType::Tonk);
            goto OnError;
        }

        MakeCallbacksOptional(ConnectionConfig);

        // TBD: We could call OnConnect() here and some apps may have lower
        // latency to establish connections.  It is already possible to react
        // with the same speed to the OnIncomingConnection() callback though.
        // Right now OnConnect() is called when the first ID update control
        // message is received from the client.
        //ConnectionConfig.OnConnect(ConnectionConfig.AppContextPtr, GetTonkConnection());

        /*
            For the server, we do not want to delay delivery of the client's ID
            until the next timed or application flush, so perform a flush here.
            This still allows the application to submit data in the first round.
        */
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());

        // Buffer enough flush space for the first connection request message
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        postNextTimer();
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::completeConnectionInitialization", "Exception!", ErrorType::Tonk);
        goto OnError;
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::completeIncomingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}